

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::AddIntsToArraySegment
               (SparseArraySegment<int> *segment,AuxArray<int> *ints)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  uVar1 = ints->count;
  if ((segment->super_SparseArraySegmentBase).left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x180a,"(segment->left == 0)","segment->left == 0");
    if (!bVar3) goto LAB_00ac2dfa;
    *puVar4 = 0;
  }
  if ((segment->super_SparseArraySegmentBase).size < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x180b,"(count <= segment->size)","count <= segment->size");
    if (!bVar3) {
LAB_00ac2dfa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((segment->super_SparseArraySegmentBase).length < uVar1) {
    (segment->super_SparseArraySegmentBase).length = uVar1;
    SparseArraySegmentBase::CheckLengthvsSize(&segment->super_SparseArraySegmentBase);
  }
  js_memcpy_s(segment + 1,(ulong)(segment->super_SparseArraySegmentBase).length << 2,ints + 1,
              (ulong)uVar1 * 4);
  return;
}

Assistant:

void JavascriptOperators::AddIntsToArraySegment(SparseArraySegment<int32> * segment, const Js::AuxArray<int32> *ints)
    {
        uint32 count = ints->count;

        Assert(segment->left == 0);
        Assert(count <= segment->size);

        if(count > segment->length)
        {
            segment->length = count;
            segment->CheckLengthvsSize();
        }
        js_memcpy_s(segment->elements, sizeof(int32) * segment->length, ints->elements, sizeof(int32) * count);
    }